

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void free_monchn(monst *mon)

{
  monst *pmVar1;
  monst *mtmp2;
  monst *mon_local;
  
  mtmp2 = mon;
  while (mtmp2 != (monst *)0x0) {
    pmVar1 = mtmp2->nmon;
    if (mtmp2->minvent != (obj *)0x0) {
      free_objchn(mtmp2->minvent);
    }
    free(mtmp2);
    mtmp2 = pmVar1;
  }
  return;
}

Assistant:

static void free_monchn(struct monst *mon)
{
	struct monst *mtmp2;

	while (mon) {
	    mtmp2 = mon->nmon;
	    
	    if (mon->minvent)
		free_objchn(mon->minvent);
	    dealloc_monst(mon);
	    mon = mtmp2;
	}
}